

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void compileoptiongetFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int n_00;
  char *in_RDX;
  undefined4 in_ESI;
  _func_void_void_ptr *in_RDI;
  int n;
  undefined4 in_stack_fffffffffffffff0;
  
  n_00 = sqlite3_value_int((sqlite3_value *)0x222deb);
  sqlite3_compileoption_get((int)((ulong)in_RDX >> 0x20));
  sqlite3_result_text((sqlite3_context *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,n_00,
                      in_RDI);
  return;
}

Assistant:

static void compileoptiongetFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int n;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  /* IMP: R-04922-24076 The sqlite_compileoption_get() SQL function
  ** is a wrapper around the sqlite3_compileoption_get() C/C++ function.
  */
  n = sqlite3_value_int(argv[0]);
  sqlite3_result_text(context, sqlite3_compileoption_get(n), -1, SQLITE_STATIC);
}